

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O2

void run_ixor_test(void)

{
  short sVar1;
  _Bool _Var2;
  uint16_t uVar3;
  array_container_t *src;
  array_container_t *src_00;
  array_container_t *src_01;
  array_container_t *paVar4;
  array_container_t *arr;
  bitset_container_t *src_2;
  bitset_container_t *src_2_00;
  bitset_container_t *pbVar5;
  run_container_t *src_02;
  run_container_t *src_2_01;
  run_container_t *src_2_02;
  run_container_t *prVar6;
  bitset_container_t *pbVar7;
  run_container_t *prVar8;
  uint uVar9;
  ulong uVar10;
  int x;
  int iVar11;
  unsigned_long uVar12;
  container_t *C;
  bitset_container_t *local_58;
  array_container_t *local_50;
  bitset_container_t *local_48;
  run_container_t *local_40;
  unsigned_long local_38;
  
  src = array_container_create();
  src_00 = array_container_create();
  src_01 = array_container_create();
  paVar4 = array_container_create();
  arr = array_container_create();
  src_2 = bitset_container_create();
  src_2_00 = bitset_container_create();
  pbVar5 = bitset_container_create();
  local_48 = bitset_container_create();
  src_02 = run_container_create();
  src_2_01 = run_container_create();
  src_2_02 = run_container_create();
  local_40 = run_container_create();
  for (uVar9 = 0; uVar9 != 0x10000; uVar9 = uVar9 + 1) {
    uVar3 = (uint16_t)uVar9;
    if ((ushort)((short)((uVar9 & 0xffff) / 5) * -5 + uVar3) < 3) {
      array_container_add(src,uVar3);
      bitset_container_set(src_2,uVar3);
      run_container_add(src_02,uVar3);
    }
  }
  for (uVar9 = 0; uVar9 != 0x10000; uVar9 = uVar9 + 1) {
    uVar3 = (uint16_t)uVar9;
    if ((ushort)((short)((uVar9 & 0xffff) / 0x3e) * -0x3e + uVar3) < 0x25) {
      array_container_add(src_00,uVar3);
      bitset_container_set(src_2_00,uVar3);
      run_container_add(src_2_01,uVar3);
    }
  }
  uVar9 = 0;
  local_50 = paVar4;
  while( true ) {
    paVar4 = local_50;
    uVar3 = (uint16_t)uVar9;
    if (uVar9 == 0x10000) break;
    if ((ushort)((short)((uVar9 & 0xffff) / 0x3e) * -0x3e + uVar3) < 0x25 !=
        (ushort)((short)((uVar9 & 0xffff) / 5) * -5 + uVar3) < 3) {
      array_container_add(arr,uVar3);
      bitset_container_set(local_48,uVar3);
    }
    uVar9 = uVar9 + 1;
  }
  uVar9 = 0;
  while( true ) {
    uVar3 = (uint16_t)uVar9;
    if (uVar9 == 0x10000) break;
    sVar1 = (short)((uVar9 & 0xffff) / 5) * -5;
    if (((ushort)(uVar3 + sVar1) < 2) || ((10000 < uVar9 && ((uint16_t)(sVar1 + uVar3) == 2)))) {
      array_container_add(src_01,uVar3);
      bitset_container_set(pbVar5,uVar3);
      run_container_add(src_2_02,uVar3);
    }
    uVar9 = uVar9 + 1;
  }
  uVar10 = 1;
  for (iVar11 = 0; iVar11 != 0x10000; iVar11 = iVar11 + 1) {
    if ((uVar10 & 3) != 0) {
      run_container_add(local_40,(uint16_t)iVar11);
      array_container_add(paVar4,(uint16_t)iVar11);
    }
    uVar10 = (ulong)((int)uVar10 * 0xd68 + 0x1a85) % 0x26f5;
  }
  local_38 = (unsigned_long)arr->cardinality;
  C = (container_t *)0x0;
  prVar6 = run_container_clone(src_02);
  _Var2 = run_bitset_container_ixor(prVar6,src_2,&C);
  _assert_true((ulong)!_Var2,"run_bitset_container_ixor(temp_r, B1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x3b4);
  _assert_int_equal(0,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3b5);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  pbVar7 = bitset_container_create();
  bitset_container_copy(src_2,pbVar7);
  _Var2 = bitset_run_container_ixor(pbVar7,src_02,&C);
  _assert_true((ulong)!_Var2,"bitset_run_container_ixor(temp_b, R1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x3bb);
  _assert_int_equal(0,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3bc);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  paVar4 = array_container_clone(src);
  iVar11 = array_run_container_ixor(paVar4,src_02,&C);
  _assert_int_equal(2,(long)iVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3c2);
  _assert_int_equal(0,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3c3);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  prVar6 = run_container_clone(src_02);
  iVar11 = run_array_container_ixor(prVar6,src,&C);
  _assert_int_equal(2,(long)iVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3c9);
  _assert_int_equal(0,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3ca);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  prVar6 = run_container_clone(src_02);
  iVar11 = run_run_container_ixor(prVar6,src_02,&C);
  _assert_int_not_equal
            (1,(long)iVar11,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
             ,0x3d2);
  if (iVar11 == 3) {
    iVar11 = run_container_cardinality((run_container_t *)C);
    _assert_int_equal(0,(long)iVar11,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                      ,0x3d4);
    run_container_free((run_container_t *)C);
  }
  else {
    _assert_int_equal(0,(long)*C,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                      ,0x3d7);
    array_container_free((array_container_t *)C);
  }
  C = (container_t *)0x0;
  prVar6 = run_container_clone(src_02);
  local_58 = pbVar5;
  _Var2 = run_bitset_container_ixor(prVar6,pbVar5,&C);
  _assert_true((ulong)!_Var2,"run_bitset_container_ixor(temp_r, B3, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x3dd);
  _assert_int_equal(2000,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3de);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  paVar4 = array_container_clone(src_01);
  iVar11 = array_run_container_ixor(paVar4,src_02,&C);
  _assert_int_equal(2,(long)iVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3e4);
  _assert_int_equal(2000,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3e5);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  pbVar5 = bitset_container_create();
  bitset_container_copy(src_2,pbVar5);
  _Var2 = bitset_run_container_ixor(pbVar5,src_2_02,&C);
  _assert_true((ulong)!_Var2,"bitset_run_container_ixor(temp_b, R3, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x3eb);
  _assert_int_equal(2000,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3ec);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  prVar6 = run_container_clone(src_2_02);
  iVar11 = run_array_container_ixor(prVar6,src,&C);
  _assert_int_equal(2,(long)iVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3f2);
  _assert_int_equal(2000,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3f3);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  prVar6 = run_container_clone(src_02);
  iVar11 = run_run_container_ixor(prVar6,src_2_02,&C);
  _assert_int_equal(2,(long)iVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3f9);
  _assert_int_equal(2000,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x3fa);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  prVar6 = run_container_clone(src_02);
  _Var2 = run_bitset_container_ixor(prVar6,src_2_00,&C);
  _assert_true((ulong)_Var2,"run_bitset_container_ixor(temp_r, B2, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x3ff);
  uVar12 = local_38;
  _assert_int_equal(local_38,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x400);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  paVar4 = array_container_clone(src_00);
  iVar11 = array_run_container_ixor(paVar4,src_02,&C);
  _assert_int_equal(1,(long)iVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x406);
  _assert_int_equal(uVar12,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x407);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  pbVar5 = bitset_container_create();
  bitset_container_copy(src_2,pbVar5);
  _Var2 = bitset_run_container_ixor(pbVar5,src_2_01,&C);
  _assert_true((ulong)_Var2,"bitset_run_container_ixor(temp_b, R2, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x40d);
  _assert_int_equal(uVar12,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x40e);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  prVar6 = run_container_clone(src_02);
  iVar11 = run_array_container_ixor(prVar6,src_00,&C);
  _assert_int_equal(1,(long)iVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x414);
  _assert_int_equal(uVar12,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x415);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  prVar6 = run_container_clone(src_02);
  iVar11 = run_run_container_ixor(prVar6,src_2_01,&C);
  _assert_int_equal(1,(long)iVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x41b);
  _assert_int_equal(uVar12,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x41c);
  bitset_container_free((bitset_container_t *)C);
  prVar6 = local_40;
  C = (container_t *)0x0;
  prVar8 = run_container_clone(local_40);
  pbVar5 = local_58;
  _Var2 = run_bitset_container_ixor(prVar8,local_58,&C);
  _assert_true((ulong)_Var2,"run_bitset_container_ixor(temp_r, B3, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x421);
  uVar12 = (unsigned_long)*C;
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  paVar4 = array_container_clone(src_01);
  iVar11 = array_run_container_ixor(paVar4,prVar6,&C);
  _assert_int_equal(1,(long)iVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x429);
  _assert_int_equal(uVar12,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x42b);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  pbVar7 = bitset_container_create();
  bitset_container_copy(pbVar5,pbVar7);
  _Var2 = bitset_run_container_ixor(pbVar7,prVar6,&C);
  _assert_true((ulong)_Var2,"bitset_run_container_ixor(temp_b, R4, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x431);
  _assert_int_equal(uVar12,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x432);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  prVar8 = run_container_clone(src_2_02);
  paVar4 = local_50;
  iVar11 = run_array_container_ixor(prVar8,local_50,&C);
  _assert_int_equal(1,(long)iVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x438);
  _assert_int_equal(uVar12,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x439);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  prVar8 = run_container_clone(prVar6);
  iVar11 = run_run_container_ixor(prVar8,src_2_02,&C);
  _assert_int_equal(1,(long)iVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x43f);
  _assert_int_equal(uVar12,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x440);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  array_container_free(src);
  array_container_free(src_00);
  array_container_free(src_01);
  array_container_free(arr);
  array_container_free(paVar4);
  bitset_container_free(src_2);
  bitset_container_free(src_2_00);
  bitset_container_free(local_58);
  bitset_container_free(local_48);
  run_container_free(src_02);
  run_container_free(src_2_01);
  run_container_free(src_2_02);
  run_container_free(prVar6);
  return;
}

Assistant:

DEFINE_TEST(run_ixor_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* A3 = array_container_create();
    array_container_t* A4 = array_container_create();
    array_container_t* AX = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* B3 = bitset_container_create();
    bitset_container_t* BX = bitset_container_create();
    run_container_t* R1 = run_container_create();
    run_container_t* R2 = run_container_create();
    run_container_t* R3 = run_container_create();
    run_container_t* R4 = run_container_create();

    // B/A1 xor R1 is empty (array or run, I guess)
    // B/A1 xor R2 is probably best left as runs
    // B/A3 xor R1 is best as an array.
    // B/A3 xor R4 is best as a bitmap

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x++) {
        if (x % 5 < 3) {
            array_container_add(A1, x);
            bitset_container_set(B1, x);
            run_container_add(R1, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 62 < 37) {
            array_container_add(A2, x);
            bitset_container_set(B2, x);
            run_container_add(R2, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 62 < 37) ^ (x % 5 < 3)) {
            array_container_add(AX, x);
            bitset_container_set(BX, x);
        }

    // the elements x%5 == 2 differ for less than 10k, otherwise same)
    for (int x = 0; x < (1 << 16); x++) {
        if ((x % 5 < 2) || ((x % 5 < 3) && (x > 10000))) {
            array_container_add(A3, x);
            bitset_container_set(B3, x);
            run_container_add(R3, x);
        }
    }

    int randstate = 1;  // for Oakenfull RNG, hope LSBits are nice
    for (int x = 0; x < (1 << 16); x++) {
        if (randstate % 4) {
            run_container_add(R4, x);
            array_container_add(A4, x);
        }
        randstate = (3432 * randstate + 6789) % 9973;
    }

    int cx12 = array_container_cardinality(AX);  // expected xor for ?1 and ?2

    container_t* C = NULL;

    run_container_t* temp_r = run_container_clone(R1);
    assert_false(run_bitset_container_ixor(temp_r, B1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    bitset_container_t* temp_b = bitset_container_create();
    bitset_container_copy(B1, temp_b);
    assert_false(bitset_run_container_ixor(temp_b, R1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    array_container_t* temp_a = array_container_clone(A1);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    // both run coding and array coding have same serialized size for
    // empty
    temp_r = run_container_clone(R1);
    int ret_type = run_run_container_ixor(temp_r, R1, &C);
    assert_int_not_equal(BITSET_CONTAINER_TYPE, ret_type);
    if (ret_type == RUN_CONTAINER_TYPE) {
        assert_int_equal(0, run_container_cardinality(CAST_run(C)));
        run_container_free(CAST_run(C));
    } else {
        assert_int_equal(0, array_container_cardinality(CAST_array(C)));
        array_container_free(CAST_array(C));
    }
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_false(run_bitset_container_ixor(temp_r, B3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_a = array_container_clone(A3);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R1, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_b = bitset_container_create();
    bitset_container_copy(B1, temp_b);
    assert_false(bitset_run_container_ixor(temp_b, R3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R3);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A1, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_run_container_ixor(temp_r, R3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_true(run_bitset_container_ixor(temp_r, B2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_a = array_container_clone(A2);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R1, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_b = bitset_container_create();
    bitset_container_copy(B1, temp_b);
    assert_true(bitset_run_container_ixor(temp_b, R2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_ixor(temp_r, R2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R4);
    assert_true(run_bitset_container_ixor(temp_r, B3, &C));
    int card_3_4 = bitset_container_cardinality(CAST_bitset(C));
    // assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_a = array_container_clone(A3);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R4, &C));
    // if this fails, either this bitset is wrong or the previous one...
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_b = bitset_container_create();
    bitset_container_copy(B3, temp_b);
    assert_true(bitset_run_container_ixor(temp_b, R4, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R3);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A4, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R4);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_ixor(temp_r, R3, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    array_container_free(A1);
    array_container_free(A2);
    array_container_free(A3);
    array_container_free(AX);
    array_container_free(A4);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(B3);
    bitset_container_free(BX);

    run_container_free(R1);
    run_container_free(R2);
    run_container_free(R3);
    run_container_free(R4);
}